

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalarValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)604>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  bool bVar7;
  LogMessage *pLVar8;
  undefined1 *puVar9;
  long *plVar10;
  ulong *puVar11;
  uint32_t uVar12;
  undefined1 *puVar13;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ulong uVar14;
  ModelDescription *interface;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  allocator_type local_b9;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  undefined1 local_a8 [40];
  pointer local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_58;
  TypeCase local_3c [3];
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_80);
  local_58.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = false;
  local_58.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = false;
  local_58.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._2_1_ = false;
  local_58.
  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ._M_impl.super__Vector_impl_data._M_start._3_1_ = false;
  validateModelDescription
            ((Result *)local_b8,interface,format->specificationversion_,
             (ValidationPolicy *)&local_58);
  local_80 = (pointer)local_b8;
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_b0);
  pcVar2 = local_a8 + 8;
  if (local_b0._M_p != pcVar2) {
    operator_delete(local_b0._M_p,local_a8._8_8_ + 1);
  }
  bVar7 = Result::good((Result *)&local_80);
  if (bVar7) {
    local_3c[0] = kInt64Type;
    local_3c[1] = kDoubleType;
    local_3c[2] = 5;
    __l._M_len = 3;
    __l._M_array = local_3c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_58,__l,&local_b9);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_b8,(CoreML *)&interface->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_58,
               in_R8);
    local_80 = (pointer)local_b8;
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_b0);
    if (local_b0._M_p != pcVar2) {
      operator_delete(local_b0._M_p,local_a8._8_8_ + 1);
    }
    pvVar4 = (void *)CONCAT44(local_58.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_58.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_58.
                                   super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4
                     );
    }
    bVar7 = Result::good((Result *)&local_80);
    if (bVar7) {
      local_3c[0] = kInt64Type;
      local_3c[1] = kDoubleType;
      local_3c[2] = 5;
      __l_00._M_len = 3;
      __l_00._M_array = local_3c;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_58,__l_00,&local_b9);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_b8,(CoreML *)&interface->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_58,
                 in_R8);
      local_80 = (pointer)local_b8;
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_b0);
      if (local_b0._M_p != pcVar2) {
        operator_delete(local_b0._M_p,local_a8._8_8_ + 1);
      }
      pvVar4 = (void *)CONCAT44(local_58.
                                super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_58.
                                super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_58.
                                     super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar4);
      }
      bVar7 = Result::good((Result *)&local_80);
      if (bVar7) {
        if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar8 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_b8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar8);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b8);
        }
        pvVar4 = ((interface->input_).super_RepeatedPtrFieldBase.rep_)->elements[0];
        if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_b8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar8 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_b8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar8);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b8);
        }
        puVar9 = *(undefined1 **)((long)pvVar4 + 0x20);
        if (puVar9 == (undefined1 *)0x0) {
          puVar9 = Specification::_FeatureType_default_instance_;
        }
        pvVar5 = ((interface->output_).super_RepeatedPtrFieldBase.rep_)->elements[0];
        iVar3 = *(int *)(puVar9 + 0x24);
        puVar13 = *(undefined1 **)((long)pvVar5 + 0x20);
        if (puVar13 == (undefined1 *)0x0) {
          puVar13 = Specification::_FeatureType_default_instance_;
        }
        if (iVar3 == 1) {
          if (*(int *)(puVar13 + 0x24) - 1U < 2) {
LAB_00314e09:
            if (format->_oneof_case_[0] == 0x25c) {
              puVar9 = (undefined1 *)(format->Type_).textclassifier_;
            }
            else {
              puVar9 = Specification::_Scaler_default_instance_;
            }
            if (*(uint *)&(((TextClassifier *)puVar9)->language_).tagged_ptr_.ptr_ < 2) {
              if (((TextClassifier *)puVar9)->revision_ < 2) goto LAB_00314e6c;
              local_b8 = (undefined1  [8])local_a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b8,
                         "For input type array, specified scale values must be empty or a scalar.",
                         "");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
            }
            else {
              local_b8 = (undefined1  [8])local_a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b8,
                         "For a scalar imput type, specified shift value must be empty or a scalar."
                         ,"");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
            }
          }
          else {
            local_b8 = (undefined1  [8])local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"Input type Int64 must output to Int64 or Double.","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
          }
        }
        else if (*(int *)(puVar13 + 0x24) == iVar3) {
          if (iVar3 != 5) goto LAB_00314e09;
          if (*(int *)(*(long *)(puVar9 + 0x18) + 0x10) == 1) {
            if (*(int *)(*(long *)(puVar13 + 0x18) + 0x10) == 1) {
              plVar10 = google::protobuf::RepeatedField<long>::Get
                                  ((RepeatedField<long> *)(*(long *)(puVar9 + 0x18) + 0x10),0);
              puVar9 = *(undefined1 **)((long)pvVar5 + 0x20);
              if (puVar9 == (undefined1 *)0x0) {
                puVar9 = Specification::_FeatureType_default_instance_;
              }
              if (*(int *)(puVar9 + 0x24) == 5) {
                puVar9 = *(undefined1 **)(puVar9 + 0x18);
              }
              else {
                puVar9 = Specification::_ArrayFeatureType_default_instance_;
              }
              lVar6 = *plVar10;
              plVar10 = google::protobuf::RepeatedField<long>::Get
                                  ((RepeatedField<long> *)(puVar9 + 0x10),0);
              if (lVar6 == *plVar10) {
                uVar12 = format->_oneof_case_[0];
                puVar9 = (undefined1 *)(format->Type_).supportvectorclassifier_;
                puVar13 = puVar9;
                if (uVar12 != 0x25c) {
                  puVar13 = Specification::_Scaler_default_instance_;
                }
                uVar14 = (ulong)(((SupportVectorClassifier *)puVar13)->
                                numberofsupportvectorsperclass_).current_size_;
                if (1 < uVar14) {
                  puVar9 = *(undefined1 **)((long)pvVar4 + 0x20);
                  if (puVar9 == (undefined1 *)0x0) {
                    puVar9 = Specification::_FeatureType_default_instance_;
                  }
                  if (*(int *)(puVar9 + 0x24) == 5) {
                    puVar9 = *(undefined1 **)(puVar9 + 0x18);
                  }
                  else {
                    puVar9 = Specification::_ArrayFeatureType_default_instance_;
                  }
                  puVar11 = (ulong *)google::protobuf::RepeatedField<long>::Get
                                               ((RepeatedField<long> *)(puVar9 + 0x10),0);
                  if (*puVar11 != uVar14) {
                    local_b8 = (undefined1  [8])local_a8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_b8,
                               "For input type array, specified shift values must be empty, a scalar, or a vector of the matching length."
                               ,"");
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)local_b8);
                    goto LAB_00315020;
                  }
                  uVar12 = format->_oneof_case_[0];
                  puVar9 = (undefined1 *)(format->Type_).scaler_;
                }
                if (uVar12 != 0x25c) {
                  puVar9 = Specification::_Scaler_default_instance_;
                }
                uVar14 = (ulong)(((SupportVectorClassifier *)puVar9)->
                                _numberofsupportvectorsperclass_cached_byte_size_).
                                super___atomic_base<int>._M_i;
                if (1 < uVar14) {
                  puVar9 = *(undefined1 **)((long)pvVar4 + 0x20);
                  if (puVar9 == (undefined1 *)0x0) {
                    puVar9 = Specification::_FeatureType_default_instance_;
                  }
                  if (*(int *)(puVar9 + 0x24) == 5) {
                    puVar9 = *(undefined1 **)(puVar9 + 0x18);
                  }
                  else {
                    puVar9 = Specification::_ArrayFeatureType_default_instance_;
                  }
                  puVar11 = (ulong *)google::protobuf::RepeatedField<long>::Get
                                               ((RepeatedField<long> *)(puVar9 + 0x10),0);
                  if (*puVar11 != uVar14) {
                    local_b8 = (undefined1  [8])local_a8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_b8,
                               "For input type array, specified scale values must be empty, a scalar, or a vector of the matching length."
                               ,"");
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)local_b8);
                    goto LAB_00315020;
                  }
                }
                goto LAB_00314e6c;
              }
            }
            local_b8 = (undefined1  [8])local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,
                       "Shape of output array does not match shape of input array.","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
          }
          else {
            local_b8 = (undefined1  [8])local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,
                       "Only 1 dimensional arrays input features are supported by the scaler.","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
          }
        }
        else {
          local_b8 = (undefined1  [8])local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,
                     "Type of input feature does not match the output type feature.","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
        }
LAB_00315020:
        if (local_b8 != (undefined1  [8])local_a8) {
          operator_delete((void *)local_b8,local_a8._0_8_ + 1);
        }
        goto LAB_00314eba;
      }
    }
  }
LAB_00314e6c:
  *(pointer *)__return_storage_ptr__ = local_80;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p == &local_68) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_68._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_78._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
LAB_00314eba:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_scaler>(const Specification::Model& format) {
        const auto& description = format.description();

            // Convenience typedefs
        typedef Specification::FeatureType FT;
        typedef Specification::Imputer::ReplaceValueCase RVC;

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(description.input(), 1,
        {FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType});

        if (!result.good()) {
            return result;
        }

        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(description.output(), 1,
        {FT::kInt64Type, FT::kDoubleType, FT::kMultiArrayType});

        if (!result.good()) {
            return result;
        }

        // Make sure the input and output type match.
        // From the above, we know that we have exactly one input and one output type.
        const auto& input = description.input()[0];
        const auto& output = description.output()[0];

        if(input.type().Type_case() == FT::kInt64Type) {
            if((output.type().Type_case() != FT::kInt64Type)
               && (output.type().Type_case() != FT::kDoubleType)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Input type Int64 must output to Int64 or Double.");
            }
        } else if(output.type().Type_case() != input.type().Type_case()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Type of input feature does not match the output type feature.");
        }

            // If it's an array, we need to test sizes.
        if(input.type().Type_case() == FT::kMultiArrayType) {
            if(input.type().multiarraytype().shape_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Only 1 dimensional arrays input features are supported by the scaler.");
            }

            if(output.type().multiarraytype().shape_size() != 1
               || (input.type().multiarraytype().shape(0) != output.type().multiarraytype().shape(0))) {
                return  Result(ResultType::INVALID_MODEL_PARAMETERS,
                               "Shape of output array does not match shape of input array.");
            }

            // Now, make sure that the repeated values make sense.
            int64_t shift_size = static_cast<int64_t>(format.scaler().shiftvalue_size());

            if(!(shift_size == 0 || shift_size == 1
                 || shift_size == input.type().multiarraytype().shape(0))) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified shift values must be empty, a scalar, or a vector of the matching length.");
            }

                // Now, make sure that the repeated values make sense.
            int64_t scale_size = static_cast<int64_t>(format.scaler().scalevalue_size());

            if(!(scale_size == 0 || scale_size == 1
                 || scale_size == input.type().multiarraytype().shape(0))) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified scale values must be empty, a scalar, or a vector of the matching length.");
            }
        } else {
                // Now, make sure that the repeated values make sense.
            size_t shift_size = static_cast<size_t>(format.scaler().shiftvalue_size());

            if(!(shift_size == 0 || shift_size == 1)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For a scalar imput type, specified shift value must be empty or a scalar.");
            }

                // Now, make sure that the repeated values make sense.
            size_t scale_size = static_cast<size_t>(format.scaler().scalevalue_size());

            if(!(scale_size == 0 || scale_size == 1)) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "For input type array, specified scale values must be empty or a scalar.");
            }
        }

        return result;
    }